

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O1

void Acec_VerifyClasses(Gia_Man_t *p,Vec_Wec_t *vLits,Vec_Wec_t *vReprs)

{
  ulong uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  ulong uVar4;
  ulong uVar5;
  uint *__ptr;
  void *pvVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Vec_Wrd_t *vTemp;
  word *pwVar9;
  Vec_Wrd_t *p_00;
  word Entry;
  byte bVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  word wVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  
  uVar2 = vLits->nSize;
  __ptr = (uint *)malloc(0x10);
  uVar11 = 8;
  if (6 < uVar2 - 1) {
    uVar11 = uVar2;
  }
  __ptr[1] = 0;
  *__ptr = uVar11;
  if (uVar11 == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = malloc((long)(int)uVar11 << 3);
  }
  *(void **)(__ptr + 2) = pvVar6;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(400);
  pVVar7->pArray = piVar8;
  iVar18 = p->nObjs;
  vTemp = (Vec_Wrd_t *)malloc(0x10);
  iVar19 = 0x10;
  if (0xe < iVar18 - 1U) {
    iVar19 = iVar18;
  }
  vTemp->nSize = 0;
  vTemp->nCap = iVar19;
  iVar17 = 0;
  if (iVar19 == 0) {
    pwVar9 = (word *)0x0;
  }
  else {
    pwVar9 = (word *)malloc((long)iVar19 << 3);
  }
  vTemp->pArray = pwVar9;
  vTemp->nSize = iVar18;
  memset(pwVar9,0,(long)iVar18 << 3);
  if (0 < vLits->nSize) {
    lVar16 = 0;
    iVar17 = 0;
    do {
      pVVar3 = vLits->pArray;
      iVar18 = pVVar3[lVar16].nSize;
      p_00 = (Vec_Wrd_t *)malloc(0x10);
      if (iVar18 - 1U < 0xf) {
        iVar18 = 0x10;
      }
      p_00->nSize = 0;
      p_00->nCap = iVar18;
      if (iVar18 == 0) {
        pwVar9 = (word *)0x0;
      }
      else {
        pwVar9 = (word *)malloc((long)iVar18 << 3);
      }
      p_00->pArray = pwVar9;
      if (0 < pVVar3[lVar16].nSize) {
        lVar22 = 0;
        do {
          Entry = Gia_ObjComputeTruth6Cis(p,pVVar3[lVar16].pArray[lVar22],pVVar7,vTemp);
          iVar18 = pVVar7->nSize;
          if ((long)iVar18 < 7) {
            wVar20 = Entry;
            if (iVar18 < 1) {
              iVar19 = 0;
            }
            else {
              piVar8 = pVVar7->pArray;
              lVar13 = 0;
              lVar15 = 0xa1ab18;
              pwVar9 = s_Truths6Neg;
              iVar19 = 0;
              do {
                bVar10 = (byte)(1 << ((byte)lVar13 & 0x1f));
                if ((*pwVar9 & (wVar20 >> (bVar10 & 0x3f) ^ wVar20)) != 0) {
                  lVar12 = (long)iVar19;
                  if (lVar12 < lVar13) {
                    if (piVar8 != (int *)0x0) {
                      piVar8[lVar12] = piVar8[lVar13];
                    }
                    bVar10 = (char)(-1 << ((byte)iVar19 & 0x1f)) + bVar10;
                    lVar12 = lVar12 * 0x90;
                    wVar20 = (wVar20 & *(ulong *)(lVar15 + 8 + lVar12)) >> (bVar10 & 0x3f) |
                             (*(ulong *)(lVar15 + lVar12) & wVar20) << (bVar10 & 0x3f) |
                             *(ulong *)(lVar15 + -8 + lVar12) & wVar20;
                  }
                  iVar19 = iVar19 + 1;
                }
                lVar13 = lVar13 + 1;
                pwVar9 = pwVar9 + 1;
                lVar15 = lVar15 + 0x18;
              } while (iVar18 != lVar13);
            }
            if ((iVar19 != iVar18) && (Entry = wVar20, iVar18 <= iVar19)) {
              __assert_fail("k < nVars",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                            ,0x754,"int Abc_Tt6MinBase(word *, int *, int)");
            }
            pVVar7->nSize = iVar19;
            if (5 < iVar19) {
              Entry = 0x1234567812345678;
            }
            iVar17 = iVar17 + (uint)(5 < iVar19);
          }
          else {
            iVar17 = iVar17 + 1;
            Entry = 0x1234567812345678;
          }
          Vec_WrdPush(p_00,Entry);
          lVar22 = lVar22 + 1;
        } while (lVar22 < pVVar3[lVar16].nSize);
      }
      uVar2 = __ptr[1];
      uVar11 = *__ptr;
      if (uVar2 == uVar11) {
        if ((int)uVar11 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar6 = malloc(0x80);
          }
          else {
            pvVar6 = realloc(*(void **)(__ptr + 2),0x80);
          }
          uVar25 = 0x10;
        }
        else {
          uVar25 = uVar11 * 2;
          if ((int)uVar25 <= (int)uVar11) goto LAB_0065f9f3;
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar6 = malloc((ulong)uVar11 << 4);
          }
          else {
            pvVar6 = realloc(*(void **)(__ptr + 2),(ulong)uVar11 << 4);
          }
        }
        *(void **)(__ptr + 2) = pvVar6;
        *__ptr = uVar25;
      }
LAB_0065f9f3:
      __ptr[1] = uVar2 + 1;
      *(Vec_Wrd_t **)(*(long *)(__ptr + 2) + (long)(int)uVar2 * 8) = p_00;
      lVar16 = lVar16 + 1;
    } while (lVar16 < vLits->nSize);
  }
  if (iVar17 != 0) {
    printf("Detected %d oversize support nodes.\n");
  }
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
    pVVar7->pArray = (int *)0x0;
  }
  free(pVVar7);
  if (vTemp->pArray != (word *)0x0) {
    free(vTemp->pArray);
    vTemp->pArray = (word *)0x0;
  }
  free(vTemp);
  if (vReprs->nSize < 1) {
    iVar18 = 0;
  }
  else {
    uVar2 = __ptr[1];
    if ((int)__ptr[1] < 1) {
      uVar2 = 0;
    }
    uVar14 = 0;
    iVar18 = 0;
    do {
      if (uVar14 == uVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pVVar7 = vReprs->pArray;
      if (0 < pVVar7[uVar14].nSize) {
        lVar16 = *(long *)(*(long *)(__ptr + 2) + uVar14 * 8);
        uVar23 = 1;
        uVar21 = 0;
        do {
          uVar1 = uVar21 + 1;
          if ((long)uVar1 < (long)pVVar7[uVar14].nSize) {
            uVar11 = pVVar7[uVar14].pArray[uVar21];
            uVar24 = uVar23;
            do {
              lVar22 = (long)*(int *)(lVar16 + 4);
              if ((lVar22 <= (long)uVar21) || (lVar22 <= (long)uVar24)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                              ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
              }
              uVar25 = pVVar7[uVar14].pArray[uVar24];
              lVar22 = *(long *)(lVar16 + 8);
              uVar4 = *(ulong *)(lVar22 + uVar21 * 8);
              uVar5 = *(ulong *)(lVar22 + uVar24 * 8);
              if ((((uVar11 == uVar25) && (iVar18 = iVar18 + 1, uVar5 != 0x1234567812345678)) &&
                  (uVar4 != 0x1234567812345678)) && (uVar4 != uVar5)) {
                printf("Rank %d:  Lit %d and %d do not pass verification.\n",uVar14 & 0xffffffff,
                       uVar21 & 0xffffffff,uVar24 & 0xffffffff);
              }
              if ((int)uVar25 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x131,"int Abc_LitNot(int)");
              }
              if ((((uVar25 ^ uVar11) == 1) && (iVar18 = iVar18 + 1, uVar4 != 0x1234567812345678))
                 && (((uVar4 ^ uVar5) != 0xffffffffffffffff && (uVar5 != 0x1234567812345678)))) {
                printf("Rank %d:  Lit %d and %d do not pass verification.\n",uVar14 & 0xffffffff,
                       uVar21 & 0xffffffff,uVar24 & 0xffffffff);
              }
              uVar24 = uVar24 + 1;
            } while ((int)uVar24 < pVVar7[uVar14].nSize);
          }
          uVar23 = uVar23 + 1;
          uVar21 = uVar1;
        } while ((long)uVar1 < (long)pVVar7[uVar14].nSize);
      }
      uVar14 = uVar14 + 1;
    } while ((long)uVar14 < (long)vReprs->nSize);
  }
  if (iVar18 != 0) {
    printf("Total errors in equivalence classes = %d.\n");
  }
  uVar2 = __ptr[1];
  if (0 < (long)(int)uVar2) {
    lVar16 = *(long *)(__ptr + 2);
    lVar22 = 0;
    do {
      pvVar6 = *(void **)(lVar16 + lVar22 * 8);
      if (pvVar6 != (void *)0x0) {
        if (*(void **)((long)pvVar6 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar6 + 8));
          *(undefined8 *)((long)pvVar6 + 8) = 0;
        }
        free(pvVar6);
      }
      lVar22 = lVar22 + 1;
    } while ((int)uVar2 != lVar22);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return;
}

Assistant:

void Acec_VerifyClasses( Gia_Man_t * p, Vec_Wec_t * vLits, Vec_Wec_t * vReprs )
{
    Vec_Ptr_t * vFunc = Vec_PtrAlloc( Vec_WecSize(vLits) );
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    Vec_Wrd_t * vTemp = Vec_WrdStart( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel;
    int i, j, k, Entry, Entry2, nOvers = 0, nErrors = 0;
    Vec_WecForEachLevel( vLits, vLevel, i )
    {
        Vec_Wrd_t * vTruths = Vec_WrdAlloc( Vec_IntSize(vLevel) );
        Vec_IntForEachEntry( vLevel, Entry, k )
        {
            word Truth = Gia_ObjComputeTruth6Cis( p, Entry, vSupp, vTemp );
            if ( Vec_IntSize(vSupp) > 6  )
            {
                nOvers++;
                Vec_WrdPush( vTruths, TRUTH_UNUSED );
                continue;
            }
            vSupp->nSize = Abc_Tt6MinBase( &Truth, vSupp->pArray, vSupp->nSize );
            if ( Vec_IntSize(vSupp) > 5  )
            {
                nOvers++;
                Vec_WrdPush( vTruths, TRUTH_UNUSED );
                continue;
            }
            Vec_WrdPush( vTruths, Truth );
        }
        Vec_PtrPush( vFunc, vTruths );
    }
    if ( nOvers )
        printf( "Detected %d oversize support nodes.\n", nOvers );
    Vec_IntFree( vSupp );
    Vec_WrdFree( vTemp );
    // verify the classes
    Vec_WecForEachLevel( vReprs, vLevel, i )
    {
        Vec_Wrd_t * vTruths = (Vec_Wrd_t *)Vec_PtrEntry( vFunc, i );
        Vec_IntForEachEntry( vLevel, Entry, k )
        Vec_IntForEachEntryStart( vLevel, Entry2, j, k+1 )
        {
            word Truth = Vec_WrdEntry( vTruths, k );
            word Truth2 = Vec_WrdEntry( vTruths, j );
            if ( Entry == Entry2 )
            {
                nErrors++;
                if ( Truth != Truth2 && Truth != TRUTH_UNUSED && Truth2 != TRUTH_UNUSED )
                    printf( "Rank %d:  Lit %d and %d do not pass verification.\n", i, k, j );
            }
            if ( Entry == Abc_LitNot(Entry2) )
            {
                nErrors++;
                if ( Truth != ~Truth2 && Truth != TRUTH_UNUSED && Truth2 != TRUTH_UNUSED )
                    printf( "Rank %d:  Lit %d and %d do not pass verification.\n", i, k, j );
            }
        }
    }
    if ( nErrors )
        printf( "Total errors in equivalence classes = %d.\n", nErrors );
    Vec_VecFree( (Vec_Vec_t *)vFunc );
}